

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O3

uint32_t FACTCue_GetVariable(FACTCue *pCue,uint16_t nIndex,float *nValue)

{
  FACTSoundBank *pFVar1;
  float fVar2;
  
  if (pCue == (FACTCue *)0x0) {
    *nValue = 0.0;
  }
  else if (nIndex != 0xffff) {
    FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);
    if (nIndex == 0) {
      pFVar1 = pCue->parentBank;
      fVar2 = (float)pFVar1->cues[pCue->index].instanceCount;
    }
    else {
      pFVar1 = pCue->parentBank;
      fVar2 = pCue->variableValues[nIndex];
    }
    *nValue = fVar2;
    FAudio_PlatformUnlockMutex(pFVar1->parentEngine->apiLock);
    return 0;
  }
  return 1;
}

Assistant:

uint32_t FACTCue_GetVariable(
	FACTCue *pCue,
	uint16_t nIndex,
	float *nValue
) {
	FACTVariable *var;
	if (pCue == NULL)
	{
		*nValue = 0.0f;
		return 1;
	}

	if (nIndex == FACTINDEX_INVALID)
	{
		return 1;
	}

	FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);

	var = &pCue->parentBank->parentEngine->variables[nIndex];
	FAudio_assert(var->accessibility & 0x01);
	FAudio_assert(var->accessibility & 0x04);

	if (nIndex == 0) /* NumCueInstances */
	{
		*nValue = pCue->parentBank->cues[pCue->index].instanceCount;
	}
	else
	{
		*nValue = pCue->variableValues[nIndex];
	}

	FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
	return 0;
}